

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O0

bool __thiscall ODDLParser::OpenDDLExport::handleNode(OpenDDLExport *this,DDLNode *node)

{
  bool bVar1;
  DllNodeList *this_00;
  bool local_61;
  undefined1 local_60 [7];
  bool success;
  string statement;
  DDLNodeIterator it;
  DDLNode *current;
  DllNodeList *childs;
  DDLNode *node_local;
  OpenDDLExport *this_local;
  
  if (node == (DDLNode *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = DDLNode::getChildNodeList(node);
    bVar1 = std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::empty
                      (this_00);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      it.m_idx = 0;
      DDLNodeIterator::DDLNodeIterator((DDLNodeIterator *)((long)&statement.field_2 + 8),this_00);
      std::__cxx11::string::string((string *)local_60);
      local_61 = true;
      while (bVar1 = DDLNodeIterator::getNext
                               ((DDLNodeIterator *)((long)&statement.field_2 + 8),
                                (DDLNode **)&it.m_idx), bVar1) {
        if (it.m_idx != 0) {
          bVar1 = writeNode(this,(DDLNode *)it.m_idx,(string *)local_60);
          local_61 = (bool)(local_61 | bVar1);
          bVar1 = handleNode(this,(DDLNode *)it.m_idx);
          if (!bVar1) {
            local_61 = false;
          }
        }
      }
      this_local._7_1_ = local_61;
      std::__cxx11::string::~string((string *)local_60);
      DDLNodeIterator::~DDLNodeIterator((DDLNodeIterator *)((long)&statement.field_2 + 8));
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OpenDDLExport::handleNode( DDLNode *node ) {
    if( ddl_nullptr == node ) {
        return true;
    }

    const DDLNode::DllNodeList &childs = node->getChildNodeList();
    if( childs.empty() ) {
        return true;
    }
    DDLNode *current( ddl_nullptr );
    DDLNodeIterator it( childs );
    std::string statement;
    bool success( true );
    while( it.getNext( &current ) ) {
        if( ddl_nullptr != current ) {
            success |= writeNode( current, statement );
            if( !handleNode( current ) ) {
                success = false;
            }
        }
    }

    return success;
}